

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

Matrix<float,_3,_3> * __thiscall
tcu::Matrix<float,_3,_3>::operator=(Matrix<float,_3,_3> *this,Matrix<float,_3,_3> *src)

{
  Matrix<float,_3,_3> *pMVar1;
  int row;
  long lVar2;
  long lVar3;
  
  pMVar1 = this;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 0x24; lVar3 = lVar3 + 0xc) {
      *(undefined4 *)((long)this + lVar3) = *(undefined4 *)((long)src + lVar3);
    }
    src = (Matrix<float,_3,_3> *)((long)src + 4);
    this = (Matrix<float,_3,_3> *)((long)this + 4);
  }
  return pMVar1;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}